

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

void __thiscall
SMBusPacket::CreateFramesForGroupCommand
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,bool has_pec)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  SMBusProtocol *pProt;
  const_reference pvVar4;
  size_type sVar5;
  SMBusByte local_f8;
  SMBusByte local_d0;
  ulong local_a8;
  size_t bcnt;
  SMBusByte local_68;
  byte local_39;
  reference pvStack_38;
  U8 pec;
  vector<SMBusByte,_std::allocator<SMBusByte>_> *chunk;
  __normal_iterator<const_std::vector<SMBusByte,_std::allocator<SMBusByte>_>_*,_std::vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>_>
  local_28;
  const_iterator ci;
  bool has_pec_local;
  SMBusAnalyzerResults *pResults_local;
  SMBusPacket *this_local;
  
  ci._M_current._7_1_ = has_pec;
  local_28._M_current =
       (vector<SMBusByte,_std::allocator<SMBusByte>_> *)
       std::
       vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
       ::begin(&this->chunks);
  while( true ) {
    chunk = (vector<SMBusByte,_std::allocator<SMBusByte>_> *)
            std::
            vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
            ::end(&this->chunks);
    bVar3 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_std::vector<SMBusByte,_std::allocator<SMBusByte>_>_*,_std::vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>_>
                        *)&chunk);
    if (!bVar3) break;
    pvStack_38 = __gnu_cxx::
                 __normal_iterator<const_std::vector<SMBusByte,_std::allocator<SMBusByte>_>_*,_std::vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>_>
                 ::operator*(&local_28);
    local_39 = 0;
    pProt = (SMBusProtocol *)std::vector<SMBusByte,_std::allocator<SMBusByte>_>::front(pvStack_38);
    SMBusByte::ToAddrFrame(&local_68,pProt);
    AnalyzerResults::AddFrame((Frame *)pResults);
    Frame::~Frame((Frame *)&local_68);
    bVar2 = local_39;
    pvVar4 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::front(pvStack_38);
    local_39 = ""[bVar2 ^ pvVar4->value];
    std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](pvStack_38,1);
    SMBusByte::ToPMBusCommandFrame((SMBusByte *)&bcnt);
    AnalyzerResults::AddFrame((Frame *)pResults);
    Frame::~Frame((Frame *)&bcnt);
    bVar2 = local_39;
    pvVar4 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](pvStack_38,1);
    local_39 = ""[(int)(uint)(bVar2 ^ pvVar4->value)];
    for (local_a8 = 2; uVar1 = local_a8,
        sVar5 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::size(pvStack_38),
        uVar1 < sVar5 - (long)(int)(uint)((ci._M_current._7_1_ & 1) != 0); local_a8 = local_a8 + 1)
    {
      pvVar4 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](pvStack_38,local_a8);
      SMBusByte::ToDataByte(&local_d0,(SMBusFrameType)pvVar4);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_d0);
      bVar2 = local_39;
      pvVar4 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](pvStack_38,local_a8);
      local_39 = ""[(int)(uint)(bVar2 ^ pvVar4->value)];
    }
    if ((ci._M_current._7_1_ & 1) != 0) {
      pvVar4 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::back(pvStack_38);
      SMBusByte::ToPECFrame(&local_f8,(U8)pvVar4);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_f8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<SMBusByte,_std::allocator<SMBusByte>_>_*,_std::vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void SMBusPacket::CreateFramesForGroupCommand( SMBusAnalyzerResults* pResults, bool has_pec ) const
{
    for( std::vector<std::vector<SMBusByte>>::const_iterator ci( chunks.begin() ); ci != chunks.end(); ++ci )
    {
        const std::vector<SMBusByte>& chunk( *ci );

        U8 pec = 0;

        pResults->AddFrame( chunk.front().ToAddrFrame( NULL ) ); // addr
        pec = SMBusCRCLookup[ pec ^ chunk.front().value ];
        pResults->AddFrame( chunk[ 1 ].ToPMBusCommandFrame() ); // command
        pec = SMBusCRCLookup[ pec ^ chunk[ 1 ].value ];

        for( size_t bcnt = 2; bcnt < chunk.size() - ( has_pec ? 1 : 0 ); ++bcnt )
        {
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            pec = SMBusCRCLookup[ pec ^ chunk[ bcnt ].value ];
        }

        if( has_pec )
            pResults->AddFrame( chunk.back().ToPECFrame( pec ) );
    }
}